

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O0

void __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale
          (image<crnlib::color_quad<unsigned_char,_int>_> *this)

{
  int iVar1;
  color_quad<unsigned_char,_int> *pcVar2;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RDI;
  component_t l;
  color_quad<unsigned_char,_int> c;
  uint x;
  uint y;
  undefined1 in_stack_ffffffffffffffdf;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_14;
  uint local_10;
  uint local_c;
  
  for (local_c = 0; local_c < in_RDI->m_height; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < in_RDI->m_width; local_10 = local_10 + 1) {
      pcVar2 = operator()(in_RDI,local_10,local_c);
      color_quad<unsigned_char,_int>::color_quad
                ((color_quad<unsigned_char,_int> *)&local_14.field_0,pcVar2);
      iVar1 = color_quad<unsigned_char,_int>::get_luma
                        ((color_quad<unsigned_char,_int> *)&local_14.field_0);
      local_14.field_0.r = (uchar)iVar1;
      local_14.field_0.g = local_14.field_0.r;
      local_14.field_0.b = local_14.field_0.r;
      pcVar2 = operator()(in_RDI,local_10,local_c);
      color_quad<unsigned_char,_int>::operator=
                (pcVar2,(color_quad<unsigned_char,_int> *)&local_14.field_0);
    }
  }
  set_grayscale(in_RDI,(bool)in_stack_ffffffffffffffdf);
  return;
}

Assistant:

void convert_to_grayscale() {
    for (uint y = 0; y < m_height; y++)
      for (uint x = 0; x < m_width; x++) {
        color_type c((*this)(x, y));
        typename color_type::component_t l = static_cast<typename color_type::component_t>(c.get_luma());
        c.r = l;
        c.g = l;
        c.b = l;
        (*this)(x, y) = c;
      }

    set_grayscale(true);
  }